

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

bool Js::JavascriptLibrary::InitializeObjectPrototype
               (DynamicObject *objectPrototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  ScriptContext *this_00;
  bool bVar1;
  undefined8 in_RAX;
  uint uVar3;
  JavascriptFunction *pJVar2;
  JavascriptMethod entryPoint;
  
  uVar3 = (uint)((ulong)in_RAX >> 0x20);
  this = (((objectPrototype->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  this_00 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  DeferredTypeHandlerBase::Convert(typeHandler,objectPrototype,mode,0xb,1);
  (*(objectPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])
            (objectPrototype,0x67,(this->super_JavascriptLibraryBase).objectConstructor.ptr,6,0,0,
             (ulong)uVar3 << 0x20);
  pJVar2 = AddFunctionToLibraryObject
                     (this,objectPrototype,0xb7,
                      (FunctionInfo *)JavascriptObject::EntryInfo::HasOwnProperty,1,'\x06');
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierSet
            ((WriteBarrierPtr<Js::JavascriptFunction> *)&this->field_0x878,pJVar2);
  AddFunctionToLibraryObject
            (this,objectPrototype,0x123,
             (FunctionInfo *)JavascriptObject::EntryInfo::PropertyIsEnumerable,1,'\x06');
  AddFunctionToLibraryObject
            (this,objectPrototype,0xc5,(FunctionInfo *)JavascriptObject::EntryInfo::IsPrototypeOf,1,
             '\x06');
  AddFunctionToLibraryObject
            (this,objectPrototype,0x172,(FunctionInfo *)JavascriptObject::EntryInfo::ToLocaleString,
             0,'\x06');
  pJVar2 = AddFunctionToLibraryObject
                     (this,objectPrototype,0x178,
                      (FunctionInfo *)JavascriptObject::EntryInfo::ToString,0,'\x06');
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierSet
            (&this->objectToStringFunction,pJVar2);
  pJVar2 = AddFunctionToLibraryObject
                     (this,objectPrototype,0x18e,
                      (FunctionInfo *)JavascriptObject::EntryInfo::ValueOf,0,'\x06');
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierSet
            (&this->objectValueOfFunction,pJVar2);
  entryPoint = FunctionInfo::GetOriginalEntryPoint
                         ((FunctionInfo *)JavascriptObject::EntryInfo::ToString);
  ScriptContext::SetBuiltInLibraryFunction(this_00,entryPoint,(this->objectToStringFunction).ptr);
  bVar1 = DynamicTypeHandler::GetHasOnlyWritableDataProperties
                    (*(DynamicTypeHandler **)
                      ((objectPrototype->super_RecyclableObject).type.ptr + 1));
  (*(objectPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x2d])
            (objectPrototype,0x1eb,(this->super_JavascriptLibraryBase).__proto__getterFunction.ptr,
             (this->super_JavascriptLibraryBase).__proto__setterFunction.ptr,0x40);
  (*(objectPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x3d])(objectPrototype,0x1eb,0);
  if (bVar1) {
    DynamicTypeHandler::SetHasOnlyWritableDataProperties
              (*(DynamicTypeHandler **)((objectPrototype->super_RecyclableObject).type.ptr + 1));
  }
  AddFunctionToLibraryObject
            (this,objectPrototype,0x1e7,(FunctionInfo *)JavascriptObject::EntryInfo::DefineGetter,2,
             '\x06');
  AddFunctionToLibraryObject
            (this,objectPrototype,0x1e8,(FunctionInfo *)JavascriptObject::EntryInfo::DefineSetter,2,
             '\x06');
  AddFunctionToLibraryObject
            (this,objectPrototype,0x1e9,(FunctionInfo *)JavascriptObject::EntryInfo::LookupGetter,1,
             '\x06');
  AddFunctionToLibraryObject
            (this,objectPrototype,0x1ea,(FunctionInfo *)JavascriptObject::EntryInfo::LookupSetter,1,
             '\x06');
  DynamicObject::SetHasNoEnumerableProperties(objectPrototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeObjectPrototype(DynamicObject* objectPrototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        JavascriptLibrary* library = objectPrototype->GetLibrary();
        ScriptContext* scriptContext = objectPrototype->GetScriptContext();
        Field(JavascriptFunction*)* builtinFuncs = library->GetBuiltinFunctions();

        typeHandler->Convert(objectPrototype, mode, 11, true);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterObject
        // so that the update is in sync with profiler
        library->AddMember(objectPrototype, PropertyIds::constructor, library->objectConstructor);
        builtinFuncs[BuiltinFunction::JavascriptObject_HasOwnProperty] = library->AddFunctionToLibraryObject(objectPrototype, PropertyIds::hasOwnProperty, &JavascriptObject::EntryInfo::HasOwnProperty, 1);
        library->AddFunctionToLibraryObject(objectPrototype, PropertyIds::propertyIsEnumerable, &JavascriptObject::EntryInfo::PropertyIsEnumerable, 1);
        library->AddFunctionToLibraryObject(objectPrototype, PropertyIds::isPrototypeOf, &JavascriptObject::EntryInfo::IsPrototypeOf, 1);
        library->AddFunctionToLibraryObject(objectPrototype, PropertyIds::toLocaleString, &JavascriptObject::EntryInfo::ToLocaleString, 0);

        library->objectToStringFunction = library->AddFunctionToLibraryObject(objectPrototype, PropertyIds::toString, &JavascriptObject::EntryInfo::ToString, 0);
        library->objectValueOfFunction = library->AddFunctionToLibraryObject(objectPrototype, PropertyIds::valueOf, &JavascriptObject::EntryInfo::ValueOf, 0);

        scriptContext->SetBuiltInLibraryFunction(JavascriptObject::EntryInfo::ToString.GetOriginalEntryPoint(), library->objectToStringFunction);

        bool hadOnlyWritableDataProperties = objectPrototype->GetDynamicType()->GetTypeHandler()->GetHasOnlyWritableDataProperties();
        objectPrototype->SetAccessors(PropertyIds::__proto__, library->Get__proto__getterFunction(), library->Get__proto__setterFunction(), PropertyOperation_NonFixedValue);
        objectPrototype->SetEnumerable(PropertyIds::__proto__, FALSE);
        // Let's pretend __proto__ is actually writable.  We'll make sure we always go through a special code path when writing to it.
        if (hadOnlyWritableDataProperties)
        {
            objectPrototype->GetDynamicType()->GetTypeHandler()->SetHasOnlyWritableDataProperties();
        }

        library->AddFunctionToLibraryObject(objectPrototype, PropertyIds::__defineGetter__, &JavascriptObject::EntryInfo::DefineGetter, 2);
        library->AddFunctionToLibraryObject(objectPrototype, PropertyIds::__defineSetter__, &JavascriptObject::EntryInfo::DefineSetter, 2);
        library->AddFunctionToLibraryObject(objectPrototype, PropertyIds::__lookupGetter__, &JavascriptObject::EntryInfo::LookupGetter, 1);
        library->AddFunctionToLibraryObject(objectPrototype, PropertyIds::__lookupSetter__, &JavascriptObject::EntryInfo::LookupSetter, 1);

        objectPrototype->SetHasNoEnumerableProperties(true);

        return true;
    }